

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_object_set___proto__(JSContext *ctx,JSValue this_val,JSValue proto)

{
  undefined1 auVar1 [16];
  uint uVar2;
  undefined8 uStack_10;
  
  if (((uint)this_val.tag & 0xfffffffe) == 2) {
    JS_ThrowTypeErrorNotAnObject(ctx);
    uStack_10 = 6;
  }
  else if (((int)proto.tag == 2) || ((int)proto.tag == -1)) {
    uVar2 = JS_SetPrototypeInternal(ctx,this_val,proto,1);
    uStack_10 = (ulong)(uVar2 >> 0x1f) * 3 + 3;
  }
  else {
    uStack_10 = 3;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uStack_10;
  return (JSValue)(auVar1 << 0x40);
}

Assistant:

static JSValue js_object_set___proto__(JSContext *ctx, JSValueConst this_val,
                                       JSValueConst proto)
{
    if (JS_IsUndefined(this_val) || JS_IsNull(this_val))
        return JS_ThrowTypeErrorNotAnObject(ctx);
    if (!JS_IsObject(proto) && !JS_IsNull(proto))
        return JS_UNDEFINED;
    if (JS_SetPrototypeInternal(ctx, this_val, proto, TRUE) < 0)
        return JS_EXCEPTION;
    else
        return JS_UNDEFINED;
}